

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_512_paramSetA.c
# Opt level: O0

void fiat_id_tc26_gost_3410_2012_512_paramSetA_inv(uint64_t *output,uint64_t *t1)

{
  fe_t_conflict1 t96;
  fe_t_conflict1 t6;
  fe_t_conflict1 t502;
  fe_t_conflict1 t48;
  fe_t_conflict1 t400;
  fe_t_conflict1 t3;
  fe_t_conflict1 t24;
  fe_t_conflict1 t200;
  fe_t_conflict1 t2;
  fe_t_conflict1 t198;
  fe_t_conflict1 t12;
  fe_t_conflict1 t102;
  fe_t_conflict1 acc;
  int i;
  uint64_t *in_stack_000007c0;
  uint64_t *in_stack_000007c8;
  uint64_t *in_stack_000007d0;
  undefined4 local_14;
  
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square((uint64_t *)t24[4],(uint64_t *)t24[3]);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul
            (in_stack_000007d0,in_stack_000007c8,in_stack_000007c0);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square((uint64_t *)t24[4],(uint64_t *)t24[3]);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul
            (in_stack_000007d0,in_stack_000007c8,in_stack_000007c0);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square((uint64_t *)t24[4],(uint64_t *)t24[3]);
  for (local_14 = 0; local_14 < 2; local_14 = local_14 + 1) {
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square((uint64_t *)t24[4],(uint64_t *)t24[3]);
  }
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul
            (in_stack_000007d0,in_stack_000007c8,in_stack_000007c0);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square((uint64_t *)t24[4],(uint64_t *)t24[3]);
  for (local_14 = 0; local_14 < 5; local_14 = local_14 + 1) {
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square((uint64_t *)t24[4],(uint64_t *)t24[3]);
  }
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul
            (in_stack_000007d0,in_stack_000007c8,in_stack_000007c0);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square((uint64_t *)t24[4],(uint64_t *)t24[3]);
  for (local_14 = 0; local_14 < 0xb; local_14 = local_14 + 1) {
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square((uint64_t *)t24[4],(uint64_t *)t24[3]);
  }
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul
            (in_stack_000007d0,in_stack_000007c8,in_stack_000007c0);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square((uint64_t *)t24[4],(uint64_t *)t24[3]);
  for (local_14 = 0; local_14 < 0x17; local_14 = local_14 + 1) {
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square((uint64_t *)t24[4],(uint64_t *)t24[3]);
  }
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul
            (in_stack_000007d0,in_stack_000007c8,in_stack_000007c0);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square((uint64_t *)t24[4],(uint64_t *)t24[3]);
  for (local_14 = 0; local_14 < 0x2f; local_14 = local_14 + 1) {
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square((uint64_t *)t24[4],(uint64_t *)t24[3]);
  }
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul
            (in_stack_000007d0,in_stack_000007c8,in_stack_000007c0);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square((uint64_t *)t24[4],(uint64_t *)t24[3]);
  for (local_14 = 0; local_14 < 5; local_14 = local_14 + 1) {
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square((uint64_t *)t24[4],(uint64_t *)t24[3]);
  }
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul
            (in_stack_000007d0,in_stack_000007c8,in_stack_000007c0);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square((uint64_t *)t24[4],(uint64_t *)t24[3]);
  for (local_14 = 0; local_14 < 0x5f; local_14 = local_14 + 1) {
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square((uint64_t *)t24[4],(uint64_t *)t24[3]);
  }
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul
            (in_stack_000007d0,in_stack_000007c8,in_stack_000007c0);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square((uint64_t *)t24[4],(uint64_t *)t24[3]);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square((uint64_t *)t24[4],(uint64_t *)t24[3]);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul
            (in_stack_000007d0,in_stack_000007c8,in_stack_000007c0);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square((uint64_t *)t24[4],(uint64_t *)t24[3]);
  for (local_14 = 0; local_14 < 199; local_14 = local_14 + 1) {
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square((uint64_t *)t24[4],(uint64_t *)t24[3]);
  }
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul
            (in_stack_000007d0,in_stack_000007c8,in_stack_000007c0);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square((uint64_t *)t24[4],(uint64_t *)t24[3]);
  for (local_14 = 0; local_14 < 0x65; local_14 = local_14 + 1) {
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square((uint64_t *)t24[4],(uint64_t *)t24[3]);
  }
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul
            (in_stack_000007d0,in_stack_000007c8,in_stack_000007c0);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square((uint64_t *)t24[4],(uint64_t *)t24[3]);
  for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square((uint64_t *)t24[4],(uint64_t *)t24[3]);
  }
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul
            (in_stack_000007d0,in_stack_000007c8,in_stack_000007c0);
  for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square((uint64_t *)t24[4],(uint64_t *)t24[3]);
  }
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul
            (in_stack_000007d0,in_stack_000007c8,in_stack_000007c0);
  for (local_14 = 0; local_14 < 2; local_14 = local_14 + 1) {
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square((uint64_t *)t24[4],(uint64_t *)t24[3]);
  }
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul
            (in_stack_000007d0,in_stack_000007c8,in_stack_000007c0);
  return;
}

Assistant:

static void fiat_id_tc26_gost_3410_2012_512_paramSetA_inv(fe_t output,
                                                          const fe_t t1) {
    int i;
    /* temporary variables */
    fe_t acc, t102, t12, t198, t2, t200, t24, t3, t400, t48, t502, t6, t96;

    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(acc, t1);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(t2, acc, t1);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(acc, t2);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(t3, acc, t1);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(acc, t3);
    for (i = 0; i < 2; i++)
        fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(acc, acc);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(t6, acc, t3);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(acc, t6);
    for (i = 0; i < 5; i++)
        fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(acc, acc);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(t12, acc, t6);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(acc, t12);
    for (i = 0; i < 11; i++)
        fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(acc, acc);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(t24, acc, t12);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(acc, t24);
    for (i = 0; i < 23; i++)
        fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(acc, acc);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(t48, acc, t24);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(acc, t48);
    for (i = 0; i < 47; i++)
        fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(acc, acc);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(t96, acc, t48);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(acc, t96);
    for (i = 0; i < 5; i++)
        fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(acc, acc);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(t102, acc, t6);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(acc, t102);
    for (i = 0; i < 95; i++)
        fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(acc, acc);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(t198, acc, t96);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(acc, t198);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(acc, acc);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(t200, acc, t2);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(acc, t200);
    for (i = 0; i < 199; i++)
        fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(acc, acc);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(t400, acc, t200);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(acc, t400);
    for (i = 0; i < 101; i++)
        fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(acc, acc);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(t502, acc, t102);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(acc, t502);
    for (i = 0; i < 3; i++)
        fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(acc, acc);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(acc, acc, t3);
    for (i = 0; i < 4; i++)
        fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(acc, acc);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(acc, acc, t1);
    for (i = 0; i < 2; i++)
        fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(acc, acc);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(output, acc, t1);
}